

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_header.cpp
# Opt level: O2

bool __thiscall pstore::trailer::signature_is_valid(trailer *this)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = std::operator==((array<unsigned_char,_8UL> *)this,
                          (array<unsigned_char,_8UL> *)&default_signature1);
  bVar2 = true;
  if (!bVar1) {
    bVar2 = std::operator==(&this->signature2,(array<unsigned_char,_8UL> *)&default_signature2);
  }
  return bVar2;
}

Assistant:

bool trailer::signature_is_valid () const noexcept {
#if PSTORE_SIGNATURE_CHECKS_ENABLED
        return a.signature1 == trailer::default_signature1 ||
               signature2 == trailer::default_signature2;
#else
        return true;
#endif
    }